

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
MipsParser::parseMacro(MipsParser *this,Parser *parser)

{
  long lVar1;
  undefined8 uVar2;
  char *__s;
  undefined8 uVar3;
  bool bVar4;
  Token *pTVar5;
  Identifier *this_00;
  size_t sVar6;
  MipsRegisterData *in_RDX;
  MipsMacroDefinition *macro;
  string_view other;
  Token token;
  Token local_90;
  
  lVar1 = *(long *)((in_RDX->grs).name._name._M_dataplus._M_p + -0x18);
  uVar2 = *(undefined8 *)(lVar1 + 0x18);
  pTVar5 = Parser::peekToken((Parser *)in_RDX,0);
  Token::Token(&local_90,pTVar5);
  if (local_90.type == Identifier) {
    Parser::eatToken((Parser *)in_RDX);
    this_00 = Token::identifierValue(&local_90);
    for (macro = mipsMacros; __s = macro->name, __s != (char *)0x0; macro = macro + 1) {
      sVar6 = strlen(__s);
      other._M_str = __s;
      other._M_len = sVar6;
      bVar4 = Identifier::operator==(this_00,other);
      if (bVar4) {
        uVar3 = *(undefined8 *)(lVar1 + 0x18);
        bVar4 = parseMacroParameters((MipsParser *)parser,(Parser *)in_RDX,macro);
        if (bVar4) {
          (*macro->function)((Parser *)this,in_RDX,(MipsImmediateData *)parser,(int)parser + 0x360);
          goto LAB_0015b7d7;
        }
        *(undefined8 *)(lVar1 + 0x18) = uVar3;
      }
    }
    *(undefined8 *)(lVar1 + 0x18) = uVar2;
  }
  *(undefined8 *)&(this->registers).grs = 0;
LAB_0015b7d7:
  Token::~Token(&local_90);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> MipsParser::parseMacro(Parser& parser)
{
	Tokenizer* tokenizer = parser.getTokenizer();
	TokenizerPosition startPos = tokenizer->getPosition();

	// Cannot be a reference (we eat below.)
	const Token token = parser.peekToken();
	if (token.type != TokenType::Identifier)
		return nullptr;
	
	parser.eatToken();
	const Identifier &identifier = token.identifierValue();
	for (int z = 0; mipsMacros[z].name != nullptr; z++)
	{
		if (identifier == mipsMacros[z].name)
		{
			TokenizerPosition tokenPos = tokenizer->getPosition();

			if (parseMacroParameters(parser,mipsMacros[z]))
			{
				return mipsMacros[z].function(parser,registers,immediate,mipsMacros[z].flags);
			}

			tokenizer->setPosition(tokenPos);
		}
	}

	// no matching macro found, restore state
	tokenizer->setPosition(startPos);
	return nullptr;
}